

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Parameter.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,ParameterDeclarationSymbol *param)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  
  if (param != (ParameterDeclarationSymbol *)0x0) {
    std::operator<<(os,"<Parameter |");
    poVar1 = std::operator<<(os," name:");
    this = &ObjectDeclarationSymbol::name(&param->super_ObjectDeclarationSymbol)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<(os," type:");
    ty = ObjectDeclarationSymbol::type(&param->super_ObjectDeclarationSymbol);
    operator<<(poVar1,ty);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<Parameter is null>");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ParameterDeclarationSymbol* param)
{
    if (!param)
        return os << "<Parameter is null>";
    os << "<Parameter |";
    os << " name:" << param->name()->valueText();
    os << " type:" << param->type();
    os << ">";
    return os;
}